

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void deld(int d,double *C)

{
  double *B;
  double *A;
  double *oup;
  double *vec;
  int j;
  int i;
  double *C_local;
  int d_local;
  
  B = (double *)malloc(0x10);
  A = (double *)malloc((long)(d + 1) << 3);
  *B = 1.0;
  B[1] = -1.0;
  *A = 1.0;
  for (vec._4_4_ = 0; vec._4_4_ < d; vec._4_4_ = vec._4_4_ + 1) {
    poly(A,B,C,vec._4_4_ + 1,2);
    for (vec._0_4_ = 0; (int)vec < vec._4_4_ + 2; vec._0_4_ = (int)vec + 1) {
      A[(int)vec] = C[(int)vec];
    }
  }
  free(B);
  free(A);
  return;
}

Assistant:

void deld(int d, double* C) {
	int i,j;
	double *vec,*oup;
	/*
	 * deld returns coefficients of [1,-1]^d
	 * eg.,
	 * d=2 yields [1,-2,1]
	 * d=3 [1,-3,3,1]
	 */ 
	vec = (double*) malloc(sizeof(double) * 2);
	oup = (double*) malloc(sizeof(double) * (d+1));
	vec[0] = 1.;
	vec[1] = -1.;
	oup[0] = 1.;
	// oup has length (d+1)
	
	for(i = 0; i < d; ++i) {
		poly(oup,vec,C,i+1,2);
		for(j = 0; j < i+2; ++j) {
			oup[j] = C[j];
		}
		
	}
	free(vec);
	free(oup);
}